

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  StkId o;
  ptrdiff_t func;
  int status;
  CallS c;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_ECX != 0) {
    index2adr(in_RDI,in_ECX);
  }
  iVar1 = luaD_pcall(unaff_retaddr,(Pfunc)in_RDI,(void *)CONCAT44(in_ESI,in_EDX),
                     CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                     CONCAT44(in_stack_ffffffffffffffe4,in_EDX));
  if ((in_EDX == -1) && (in_RDI->ci->top <= in_RDI->top)) {
    in_RDI->ci->top = in_RDI->top;
  }
  return iVar1;
}

Assistant:

static int lua_pcall(lua_State*L,int nargs,int nresults,int errfunc){
struct CallS c;
int status;
ptrdiff_t func;
api_checknelems(L,nargs+1);
checkresults(L,nargs,nresults);
if(errfunc==0)
func=0;
else{
StkId o=index2adr(L,errfunc);
api_checkvalidindex(L,o);
func=savestack(L,o);
}
c.func=L->top-(nargs+1);
c.nresults=nresults;
status=luaD_pcall(L,f_call,&c,savestack(L,c.func),func);
adjustresults(L,nresults);
return status;
}